

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database_manager.cpp
# Opt level: O3

vector<std::reference_wrapper<duckdb::AttachedDatabase>,_true> * __thiscall
duckdb::DatabaseManager::GetDatabases
          (vector<std::reference_wrapper<duckdb::AttachedDatabase>,_true> *__return_storage_ptr__,
          DatabaseManager *this,ClientContext *context)

{
  pointer *pprVar1;
  iterator iVar2;
  pointer this_00;
  pointer pCVar3;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  (__return_storage_ptr__->
  super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
  ).
  super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
  ).
  super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
  ).
  super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true>::
            operator->(&this->databases);
  local_38._8_8_ = 0;
  local_20 = ::std::
             _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/main/database_manager.cpp:213:27)>
             ::_M_invoke;
  local_28 = ::std::
             _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/main/database_manager.cpp:213:27)>
             ::_M_manager;
  local_38._M_unused._M_object = __return_storage_ptr__;
  CatalogSet::Scan(this_00,context,(function<void_(duckdb::CatalogEntry_&)> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  local_38._M_unused._M_object =
       unique_ptr<duckdb::AttachedDatabase,_std::default_delete<duckdb::AttachedDatabase>,_true>::
       operator*(&this->system);
  iVar2._M_current =
       (__return_storage_ptr__->
       super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
       ).
       super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (__return_storage_ptr__->
      super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
      ).
      super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    ::std::
    vector<std::reference_wrapper<duckdb::AttachedDatabase>,std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>>>
    ::_M_realloc_insert<std::reference_wrapper<duckdb::AttachedDatabase>>
              ((vector<std::reference_wrapper<duckdb::AttachedDatabase>,std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>>>
                *)__return_storage_ptr__,iVar2,
               (reference_wrapper<duckdb::AttachedDatabase> *)&local_38);
  }
  else {
    (iVar2._M_current)->_M_data = (AttachedDatabase *)local_38._M_unused._0_8_;
    pprVar1 = &(__return_storage_ptr__->
               super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
               ).
               super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pprVar1 = *pprVar1 + 1;
  }
  pCVar3 = unique_ptr<duckdb::ClientData,_std::default_delete<duckdb::ClientData>,_true>::operator->
                     (&context->client_data);
  local_38._M_unused._M_object =
       shared_ptr<duckdb::AttachedDatabase,_true>::operator*(&pCVar3->temporary_objects);
  iVar2._M_current =
       (__return_storage_ptr__->
       super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
       ).
       super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (__return_storage_ptr__->
      super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
      ).
      super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    ::std::
    vector<std::reference_wrapper<duckdb::AttachedDatabase>,std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>>>
    ::_M_realloc_insert<std::reference_wrapper<duckdb::AttachedDatabase>>
              ((vector<std::reference_wrapper<duckdb::AttachedDatabase>,std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>>>
                *)__return_storage_ptr__,iVar2,
               (reference_wrapper<duckdb::AttachedDatabase> *)&local_38);
  }
  else {
    (iVar2._M_current)->_M_data = (AttachedDatabase *)local_38._M_unused._0_8_;
    pprVar1 = &(__return_storage_ptr__->
               super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
               ).
               super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pprVar1 = *pprVar1 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<reference<AttachedDatabase>> DatabaseManager::GetDatabases(ClientContext &context) {
	vector<reference<AttachedDatabase>> result;
	databases->Scan(context, [&](CatalogEntry &entry) { result.push_back(entry.Cast<AttachedDatabase>()); });
	result.push_back(*system);
	result.push_back(*context.client_data->temporary_objects);
	return result;
}